

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O3

LLVMValueRef
CompileLlvmExternalFunctionWrapper(LlvmCompilationContext *ctx,FunctionData *functionData)

{
  VariableData *pVVar1;
  TypeBase *pTVar2;
  FunctionData *pFVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  TypeBase *pTVar7;
  VariableHandle *pVVar8;
  SmallArray<LLVMValueRefOpaque_*,_3U> arguments;
  SmallArray<LLVMValueRefOpaque_*,_3U> local_90;
  TypeBase *local_60;
  TypeBase *local_58;
  FunctionData *local_50;
  LLVMValueRef local_48;
  FunctionData *pFStack_40;
  
  if ((ctx->functions).count <= functionData->functionIndex) {
    __assert_fail("index < count",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                  ,0x199,
                  "T &SmallArray<LLVMValueRefOpaque *, 128>::operator[](unsigned int) [T = LLVMValueRefOpaque *, N = 128]"
                 );
  }
  local_48 = ctx->currentFunction;
  pFStack_40 = ctx->currentFunctionSource;
  ctx->currentFunction = (ctx->functions).data[functionData->functionIndex];
  ctx->currentFunctionSource = functionData;
  local_58 = functionData->type->returnType;
  iVar6 = 0;
  if (local_58 == (TypeBase *)0x0) {
    local_58 = (TypeBase *)0x0;
  }
  else if (local_58->typeID - 2 < 3) {
    local_58 = ctx->ctx->typeInt;
  }
  local_60 = ctx->ctx->typeVoid;
  pVVar8 = (functionData->argumentVariables).head;
  local_50 = functionData;
  if (pVVar8 != (VariableHandle *)0x0) {
    iVar6 = 0;
    do {
      pVVar1 = pVVar8->variable;
      pTVar7 = pVVar1->type;
      if (pTVar7 == (TypeBase *)0x0) {
        pTVar7 = (TypeBase *)0x0;
      }
      else if (pTVar7->typeID - 2 < 3) {
        pTVar7 = ctx->ctx->typeInt;
      }
      CompileLlvmType(ctx,pTVar7);
      if (pTVar7 != pVVar1->type) {
        CompileLlvmType(ctx,pTVar7);
      }
      iVar4 = (int)pTVar7->size;
      if (pTVar7->size == 0) {
        iVar4 = 4;
      }
      iVar6 = iVar6 + iVar4;
      pVVar8 = pVVar8->next;
    } while (pVVar8 != (VariableHandle *)0x0);
  }
  pFVar3 = local_50;
  pVVar1 = local_50->contextArgument;
  if (pVVar1 == (VariableData *)0x0) {
    iVar4 = 8;
  }
  else {
    CompileLlvmType(ctx,local_50->contextType);
    CompileLlvmType(ctx,pVVar1->type);
    iVar4 = (int)pVVar1->type->size;
  }
  pTVar7 = local_58;
  if (iVar4 + iVar6 == (int)pFVar3->argumentsSize) {
    if (pFVar3->coroutine == true) {
      __assert_fail("!functionData->coroutine",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                    ,0x954,
                    "LLVMValueRef CompileLlvmExternalFunctionWrapper(LlvmCompilationContext &, FunctionData *)"
                   );
    }
    local_90.allocator = ctx->allocator;
    local_90.data = local_90.little;
    local_90.count = 0;
    local_90.max = 3;
    CompileLlvmType(ctx,ctx->ctx->typeInt);
    if (local_90.count == local_90.max) {
      SmallArray<LLVMValueRefOpaque_*,_3U>::grow(&local_90,local_90.count);
    }
    if (local_90.data != (LLVMValueRefOpaque **)0x0) {
      uVar5 = local_90._8_8_ & 0xffffffff;
      local_90.count = local_90.count + 1;
      local_90.data[uVar5] = (LLVMValueRefOpaque *)&placeholderValue;
      CompileLlvmType(ctx,ctx->ctx->typeNullPtr);
      if (local_90.count == local_90.max) {
        SmallArray<LLVMValueRefOpaque_*,_3U>::grow(&local_90,local_90.count);
      }
      if (local_90.data != (LLVMValueRefOpaque **)0x0) {
        uVar5 = local_90._8_8_ & 0xffffffff;
        local_90.count = local_90.count + 1;
        local_90.data[uVar5] = (LLVMValueRefOpaque *)&placeholderValue;
        pTVar2 = ctx->ctx->typeNullPtr;
        if (pTVar7 == local_60) {
          CompileLlvmType(ctx,pTVar2);
          if (local_90.count == local_90.max) {
            SmallArray<LLVMValueRefOpaque_*,_3U>::grow(&local_90,local_90.count);
          }
        }
        else {
          CompileLlvmType(ctx,pTVar2);
          if (local_90.count == local_90.max) {
            SmallArray<LLVMValueRefOpaque_*,_3U>::grow(&local_90,local_90.count);
          }
        }
        if (local_90.data != (LLVMValueRefOpaque **)0x0) {
          uVar5 = local_90._8_8_ & 0xffffffff;
          local_90.count = local_90.count + 1;
          local_90.data[uVar5] = (LLVMValueRefOpaque *)&placeholderValue;
          SmallArray<LLVMValueRefOpaque_*,_3U>::~SmallArray(&local_90);
          if (pFVar3->type->returnType != ctx->ctx->typeVoid) {
            CompileLlvmType(ctx,pTVar7);
            pTVar2 = pFVar3->type->returnType;
            if (pTVar7 != pTVar2) {
              CompileLlvmType(ctx,pTVar2);
            }
          }
          ctx->currentFunction = local_48;
          ctx->currentFunctionSource = pFStack_40;
          return (LLVMValueRef)0x0;
        }
      }
    }
    __assert_fail("data",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                  ,0x162,
                  "void SmallArray<LLVMValueRefOpaque *, 3>::push_back(const T &) [T = LLVMValueRefOpaque *, N = 3]"
                 );
  }
  __assert_fail("argBufferPos == unsigned(functionData->argumentsSize)",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                ,0x952,
                "LLVMValueRef CompileLlvmExternalFunctionWrapper(LlvmCompilationContext &, FunctionData *)"
               );
}

Assistant:

LLVMValueRef CompileLlvmExternalFunctionWrapper(LlvmCompilationContext &ctx, FunctionData *functionData)
{
	LLVMValueRef function = ctx.functions[functionData->functionIndex];

	// Store state
	LLVMValueRef currentFunction = ctx.currentFunction;
	FunctionData *currentFunctionSource = ctx.currentFunctionSource;

	// Switch to new function
	ctx.currentFunction = function;
	ctx.currentFunctionSource = functionData;

	LLVMBasicBlockRef block = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "start");

	LLVMPositionBuilderAtEnd(ctx.builder, block);

	// Create argument buffer
	LLVMValueRef argBuffer = LLVMBuildAlloca(ctx.builder, LLVMArrayType(LLVMInt8TypeInContext(ctx.context), unsigned(functionData->argumentsSize)), "arg_buffer");

	// Return small numeric types as 'int'
	TypeBase *returnType = functionData->type->returnType;

	if(isType<TypeBool>(returnType) || isType<TypeChar>(returnType) || isType<TypeShort>(returnType))
		returnType = ctx.ctx.typeInt;

	// Create return buffer
	LLVMValueRef retBuffer = returnType == ctx.ctx.typeVoid ? NULL : LLVMBuildAlloca(ctx.builder, LLVMArrayType(LLVMInt8TypeInContext(ctx.context), unsigned(returnType->size)), "ret_buffer");

	// Copy all arguments into argument buffer
	unsigned argIndex = 0;
	unsigned argBufferPos = 0;

	if(IsStructReturnType(functionData->type->returnType))
		argIndex++;

	for(VariableHandle *curr = functionData->argumentVariables.head; curr; curr = curr->next)
	{
		VariableData *variable = curr->variable;

		LLVMValueRef indices[] = { LLVMConstInt(LLVMInt32TypeInContext(ctx.context), 0, true), LLVMConstInt(LLVMInt32TypeInContext(ctx.context), argBufferPos, true) };

		LLVMValueRef address = LLVMBuildGEP(ctx.builder, argBuffer, indices, 2, "");

		TypeBase *argumentType = variable->type;

		// Pass small numeric types as 'int'
		if(isType<TypeBool>(argumentType) || isType<TypeChar>(argumentType) || isType<TypeShort>(argumentType))
			argumentType = ctx.ctx.typeInt;

		LLVMValueRef target = LLVMBuildPointerCast(ctx.builder, address, LLVMPointerType(CompileLlvmType(ctx, argumentType), 0), "arg_buffer_pos");

		if(IsStructArgumentType(argumentType))
		{
			LLVMValueRef argument = LLVMGetParam(function, argIndex++);

			LLVMBuildStore(ctx.builder, LLVMBuildLoad(ctx.builder, argument, ""), target);
		}
		else
		{
			LLVMValueRef argument = LLVMGetParam(function, argIndex++);

			if(argumentType != variable->type)
			{
				if(isType<TypeBool>(variable->type))
					argument = LLVMBuildZExt(ctx.builder, argument, CompileLlvmType(ctx, argumentType), "");
				else
					argument = LLVMBuildSExt(ctx.builder, argument, CompileLlvmType(ctx, argumentType), "");
			}

			LLVMBuildStore(ctx.builder, argument, target);
		}

		argBufferPos += argumentType->size == 0 ? 4u : unsigned(argumentType->size);
	}

	if(VariableData *variable = functionData->contextArgument)
	{
		LLVMValueRef indices[] = { LLVMConstInt(LLVMInt32TypeInContext(ctx.context), 0, true), LLVMConstInt(LLVMInt32TypeInContext(ctx.context), argBufferPos, true) };

		LLVMValueRef address = LLVMBuildGEP(ctx.builder, argBuffer, indices, 2, "");

		LLVMValueRef argument = LLVMGetParam(function, argIndex++);

		argument = LLVMBuildPointerCast(ctx.builder, argument, CompileLlvmType(ctx, functionData->contextType), "context_reinterpret");

		LLVMBuildStore(ctx.builder, argument, LLVMBuildPointerCast(ctx.builder, address, LLVMPointerType(CompileLlvmType(ctx, variable->type), 0), "arg_buffer_pos"));

		argBufferPos += unsigned(variable->type->size);
	}
	else
	{
		argBufferPos += NULLC_PTR_SIZE;
	}

	assert(argBufferPos == unsigned(functionData->argumentsSize));

	assert(!functionData->coroutine);

	// Call helper function
	{
		SmallArray<LLVMValueRef, 3> arguments(ctx.allocator);

		arguments.push_back(LLVMConstInt(CompileLlvmType(ctx, ctx.ctx.typeInt), functionData->functionIndex, true));
		arguments.push_back(LLVMBuildPointerCast(ctx.builder, argBuffer, CompileLlvmType(ctx, ctx.ctx.typeNullPtr), "arg_buffer_raw_ptr"));

		if(retBuffer)
			arguments.push_back(LLVMBuildPointerCast(ctx.builder, retBuffer, CompileLlvmType(ctx, ctx.ctx.typeNullPtr), "ret_buffer_raw_ptr"));
		else
			arguments.push_back(LLVMConstPointerNull(CompileLlvmType(ctx, ctx.ctx.typeNullPtr)));

		LLVMBuildCall(ctx.builder, LLVMGetNamedFunction(ctx.module, "__llvmExternalCall"), arguments.data, arguments.count, "");
	}

	if(functionData->type->returnType == ctx.ctx.typeVoid)
	{
		LLVMBuildRetVoid(ctx.builder);
	}
	else if(IsStructReturnType(functionData->type->returnType))
	{
		LLVMValueRef result = LLVMBuildLoad(ctx.builder, LLVMBuildPointerCast(ctx.builder, retBuffer, LLVMPointerType(CompileLlvmType(ctx, functionData->type->returnType), 0), "result_ptr"), "result");

		LLVMValueRef argument = LLVMGetParam(function, 0);

		LLVMBuildStore(ctx.builder, result, argument);

		LLVMBuildRetVoid(ctx.builder);
	}
	else
	{
		LLVMValueRef result = LLVMBuildLoad(ctx.builder, LLVMBuildPointerCast(ctx.builder, retBuffer, LLVMPointerType(CompileLlvmType(ctx, returnType), 0), "result_ptr"), "result");

		if(returnType != functionData->type->returnType)
			result = LLVMBuildTrunc(ctx.builder, result, CompileLlvmType(ctx, functionData->type->returnType), "");

		LLVMBuildRet(ctx.builder, result);
	}

	CheckFunction(ctx, ctx.currentFunction, functionData->name->name);

	if(LLVMRunFunctionPassManager(ctx.functionPassManager, function))
		LLVMRunFunctionPassManager(ctx.functionPassManager, function);

	// Restore state
	ctx.currentFunction = currentFunction;
	ctx.currentFunctionSource = currentFunctionSource;

	return NULL;
}